

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::SchemaParser::ModuleImpl::embedRelative
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,ModuleImpl *this,
          StringPtr embedPath)

{
  SchemaFile *pSVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  ArrayDisposer *local_20;
  
  pSVar1 = (this->file).ptr;
  (*pSVar1->_vptr_SchemaFile[2])(&local_30,pSVar1,embedPath.content.ptr,embedPath.content.size_);
  plVar3 = (long *)CONCAT44(uStack_24,uStack_28);
  if (plVar3 == (long *)0x0) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    puVar2 = (undefined8 *)CONCAT44(uStack_2c,local_30);
    (**(code **)(*plVar3 + 8))(&local_30,plVar3);
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined4 *)&(__return_storage_ptr__->ptr).field_1 = local_30;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 4) = uStack_2c;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uStack_28;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xc) = uStack_24;
    (__return_storage_ptr__->ptr).field_1.value.disposer = local_20;
    (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    KJ_IF_MAYBE(importedFile, file->import(embedPath)) {
      return importedFile->get()->readContent().releaseAsBytes();
    } else {
      return nullptr;
    }
  }